

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O1

void av1_model_rd_curvfit
               (BLOCK_SIZE bsize,double sse_norm,double xqr,double *rate_f,double *distbysse_f)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  undefined3 in_register_00000039;
  double dVar8;
  double dVar9;
  
  if (xqr <= -14.999999) {
    xqr = -14.999999;
  }
  if (15.999999 <= xqr) {
    xqr = 15.999999;
  }
  bVar5 = ""[CONCAT31(in_register_00000039,bsize)];
  dVar9 = xqr + 15.5 + xqr + 15.5;
  dVar8 = floor(dVar9);
  dVar9 = dVar9 - (double)(int)dVar8;
  lVar6 = (long)(int)dVar8;
  lVar1 = (ulong)bVar5 * 0x200 + (ulong)bVar5 * 8;
  dVar8 = *(double *)(&UNK_00dbaf28 + lVar6 * 8 + lVar1);
  dVar2 = interp_rgrid_curv[0][(ulong)bVar5 + (ulong)bVar5 * 0x40 + lVar6];
  dVar3 = *(double *)(lVar1 + 0xdbaf38 + lVar6 * 8);
  dVar4 = *(double *)(lVar1 + 0xdbaf40 + lVar6 * 8);
  *rate_f = (((((dVar2 - dVar3) * 3.0 + dVar4) - dVar8) * dVar9 +
             ((dVar3 * 4.0 + dVar8 + dVar8 + dVar2 * -5.0) - dVar4)) * dVar9 + (dVar3 - dVar8)) *
            dVar9 * 0.5 + dVar2;
  uVar7 = (ulong)((uint)(16.0 < sse_norm) * 0x200 + (uint)(16.0 < sse_norm) * 8);
  dVar8 = *(double *)(uVar7 + 0xdbb748 + lVar6 * 8);
  dVar2 = *(double *)((long)interp_dgrid_curv[0] + lVar6 * 8 + uVar7);
  dVar3 = *(double *)(uVar7 + 0xdbb758 + lVar6 * 8);
  dVar4 = *(double *)(uVar7 + 0xdbb760 + lVar6 * 8);
  *distbysse_f = (((((dVar2 - dVar3) * 3.0 + dVar4) - dVar8) * dVar9 +
                  ((dVar3 * 4.0 + dVar8 + dVar8 + dVar2 * -5.0) - dVar4)) * dVar9 + (dVar3 - dVar8))
                 * dVar9 * 0.5 + dVar2;
  return;
}

Assistant:

void av1_model_rd_curvfit(BLOCK_SIZE bsize, double sse_norm, double xqr,
                          double *rate_f, double *distbysse_f) {
  const double x_start = -15.5;
  const double x_end = 16.5;
  const double x_step = 0.5;
  const double epsilon = 1e-6;
  const int rcat = bsize_curvfit_model_cat_lookup[bsize];
  const int dcat = sse_norm_curvfit_model_cat_lookup(sse_norm);
  (void)x_end;

  xqr = AOMMAX(xqr, x_start + x_step + epsilon);
  xqr = AOMMIN(xqr, x_end - x_step - epsilon);
  const double x = (xqr - x_start) / x_step;
  const int xi = (int)floor(x);
  const double xo = x - xi;

  assert(xi > 0);

  const double *prate = &interp_rgrid_curv[rcat][(xi - 1)];
  *rate_f = interp_cubic(prate, xo);
  const double *pdist = &interp_dgrid_curv[dcat][(xi - 1)];
  *distbysse_f = interp_cubic(pdist, xo);
}